

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCMSegment.cpp
# Opt level: O0

void __thiscall
Storage::Disk::PCMSegmentEventSource::PCMSegmentEventSource
          (PCMSegmentEventSource *this,PCMSegmentEventSource *original)

{
  element_type *peVar1;
  PCMSegmentEventSource *original_local;
  PCMSegmentEventSource *this_local;
  
  std::shared_ptr<Storage::Disk::PCMSegment>::shared_ptr(&this->segment_);
  Track::Event::Event(&this->next_event_);
  Numeric::LFSR<unsigned_long,_9223372036854782434UL>::LFSR(&this->lfsr_);
  std::shared_ptr<Storage::Disk::PCMSegment>::operator=(&this->segment_,&original->segment_);
  peVar1 = std::
           __shared_ptr_access<Storage::Disk::PCMSegment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Storage::Disk::PCMSegment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  (this->next_event_).length.clock_rate = (peVar1->length_of_a_bit).clock_rate;
  reset(this);
  return;
}

Assistant:

PCMSegmentEventSource::PCMSegmentEventSource(const PCMSegmentEventSource &original) {
	// share underlying data with the original
	segment_ = original.segment_;

	// load up the clock rate and set initial conditions
	next_event_.length.clock_rate = segment_->length_of_a_bit.clock_rate;
	reset();
}